

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void Lib::Timer::updateInstructionCount(void)

{
  if (-1 < PERF_FD) {
    read(PERF_FD,&LAST_INSTRUCTION_COUNT_READ,8);
  }
  return;
}

Assistant:

void updateInstructionCount()
{
#if VAMPIRE_PERF_EXISTS
  if (PERF_FD >= 0) {
    // we could also decide not to guard this read by env.options->instructionLimit(),
    // to get info about instructions burned even when not instruction limiting
    read(PERF_FD, &LAST_INSTRUCTION_COUNT_READ, sizeof(long long));
  }
#endif
}